

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizationProblem.cpp
# Opt level: O0

void __thiscall
iDynTree::optimization::OptimizationProblem::OptimizationProblem(OptimizationProblem *this)

{
  OptimizationProblemInfoData *this_00;
  undefined8 *in_RDI;
  OptimizationProblemInfoData *in_stack_ffffffffffffffa8;
  shared_ptr<iDynTree::optimization::OptimizationProblemInfoData> *in_stack_ffffffffffffffb0;
  OptimizationProblemInfo *this_01;
  
  *in_RDI = &PTR__OptimizationProblem_003fb468;
  this_00 = (OptimizationProblemInfoData *)operator_new(8);
  OptimizationProblemInfoData::OptimizationProblemInfoData(this_00);
  std::shared_ptr<iDynTree::optimization::OptimizationProblemInfoData>::
  shared_ptr<iDynTree::optimization::OptimizationProblemInfoData,void>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  this_01 = (OptimizationProblemInfo *)(in_RDI + 3);
  std::shared_ptr<iDynTree::optimization::OptimizationProblemInfoData>::shared_ptr
            ((shared_ptr<iDynTree::optimization::OptimizationProblemInfoData> *)this_01,
             (shared_ptr<iDynTree::optimization::OptimizationProblemInfoData> *)
             in_stack_ffffffffffffffa8);
  OptimizationProblemInfo::OptimizationProblemInfo
            (this_01,(shared_ptr<iDynTree::optimization::OptimizationProblemInfoData> *)
                     in_stack_ffffffffffffffa8);
  std::shared_ptr<iDynTree::optimization::OptimizationProblemInfoData>::~shared_ptr
            ((shared_ptr<iDynTree::optimization::OptimizationProblemInfoData> *)0x3a5c24);
  return;
}

Assistant:

OptimizationProblem::OptimizationProblem()
        :m_infoData(new OptimizationProblemInfoData)
        ,m_info(m_infoData)
        {
        }